

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_mem_stream.cpp
# Opt level: O0

ssize_t __thiscall
dpfb::streams::ConstMemStream::read(ConstMemStream *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  size_t maxRead;
  size_t dstSize_local;
  void *dst_local;
  ConstMemStream *this_local;
  
  if ((((void *)CONCAT44(in_register_00000034,__fd) == (void *)0x0) || (__buf == (void *)0x0)) ||
     (this->dataSize <= this->pos)) {
    this_local = (ConstMemStream *)0x0;
  }
  else {
    pvVar1 = (void *)(this->dataSize - this->pos);
    maxRead = (size_t)__buf;
    if (pvVar1 < __buf) {
      maxRead = (size_t)pvVar1;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->data + this->pos,maxRead);
    this->pos = maxRead + this->pos;
    this_local = (ConstMemStream *)maxRead;
  }
  return (ssize_t)this_local;
}

Assistant:

std::size_t ConstMemStream::read(void* dst, std::size_t dstSize) noexcept
{
    if (!dst || dstSize == 0 || pos >= dataSize)
        return 0;

    std::size_t maxRead = dataSize - pos;
    if (dstSize > maxRead)
        dstSize = maxRead;

    std::memcpy(dst, data + pos, dstSize);
    pos += dstSize;

    return dstSize;
}